

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::
ParameterizedTestSuiteInfo<solitaire::colliders::StockPileColliderGetUncoveredCardsPositionTests>::
ParameterizedTestSuiteInfo
          (ParameterizedTestSuiteInfo<solitaire::colliders::StockPileColliderGetUncoveredCardsPositionTests>
           *this,char *name,CodeLocation *code_location)

{
  pointer pcVar1;
  allocator<char> local_11;
  
  (this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase =
       (_func_int **)&PTR__ParameterizedTestSuiteInfo_00320d80;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->test_suite_name_,name,&local_11);
  (this->code_location_).file._M_dataplus._M_p = (pointer)&(this->code_location_).file.field_2;
  pcVar1 = (code_location->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->code_location_,pcVar1,pcVar1 + (code_location->file)._M_string_length)
  ;
  (this->code_location_).line = code_location->line;
  (this->tests_).
  super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<solitaire::colliders::StockPileColliderGetUncoveredCardsPositionTests>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<solitaire::colliders::StockPileColliderGetUncoveredCardsPositionTests>::TestInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tests_).
  super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<solitaire::colliders::StockPileColliderGetUncoveredCardsPositionTests>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<solitaire::colliders::StockPileColliderGetUncoveredCardsPositionTests>::TestInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tests_).
  super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<solitaire::colliders::StockPileColliderGetUncoveredCardsPositionTests>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<solitaire::colliders::StockPileColliderGetUncoveredCardsPositionTests>::TestInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->instantiations_).
  super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<solitaire::colliders::StockPileColliderGetUncoveredCardsPositionTests>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<solitaire::colliders::StockPileColliderGetUncoveredCardsPositionTests>::InstantiationInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->instantiations_).
  super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<solitaire::colliders::StockPileColliderGetUncoveredCardsPositionTests>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<solitaire::colliders::StockPileColliderGetUncoveredCardsPositionTests>::InstantiationInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->instantiations_).
  super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<solitaire::colliders::StockPileColliderGetUncoveredCardsPositionTests>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<solitaire::colliders::StockPileColliderGetUncoveredCardsPositionTests>::InstantiationInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

explicit ParameterizedTestSuiteInfo(const char* name,
                                      CodeLocation code_location)
      : test_suite_name_(name), code_location_(code_location) {}